

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O2

void __thiscall LTWeather::Log(LTWeather *this,string *msg)

{
  pointer pcVar1;
  ostream *poVar2;
  char *pcVar3;
  long lVar4;
  string local_1c0;
  ostringstream lOut;
  undefined8 local_198 [2];
  uint auStack_188 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&lOut);
  *(uint *)((long)auStack_188 + *(long *)(_lOut + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_lOut + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18)) = 1;
  poVar2 = std::operator<<((ostream *)&lOut,"pos:         ");
  positionTy::operator_cast_to_string(&local_1c0,&this->pos);
  poVar2 = std::operator<<(poVar2,(string *)&local_1c0);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_1c0);
  poVar2 = std::operator<<((ostream *)&lOut,"vis:         ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->visibility_reported_sm);
  std::operator<<(poVar2,"sm, ");
  poVar2 = std::operator<<((ostream *)&lOut,"sea_pressure: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->sealevel_pressure_pas);
  std::operator<<(poVar2,"pas, ");
  poVar2 = std::operator<<((ostream *)&lOut,"sea_temp: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->sealevel_temperature_c);
  std::operator<<(poVar2,"C, ");
  poVar2 = std::operator<<((ostream *)&lOut,"qnh_base_elev: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->qnh_base_elevation);
  std::operator<<(poVar2,"?, ");
  poVar2 = std::operator<<((ostream *)&lOut,"qnh_pas:");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->qnh_pas);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)&lOut,"rain: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->rain_percent * 100.0);
  std::operator<<(poVar2,"%,\n");
  std::operator<<((ostream *)&lOut,"wind_alt:    ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->wind_speed_msc)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"m\n");
  std::operator<<((ostream *)&lOut,"wind_speed:  ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->wind_direction_degt)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"kts\n");
  std::operator<<((ostream *)&lOut,"wind_dir:    ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->shear_speed_msc)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"deg\n");
  std::operator<<((ostream *)&lOut,"shear_speed: ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->shear_direction_degt)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"kts\n");
  std::operator<<((ostream *)&lOut,"shear_dir:   ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<(&lOut,*(float *)((long)(this->turbulence)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"deg\n");
  std::operator<<((ostream *)&lOut,"turbulence:  ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->dewpoint_deg_c)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"\n");
  std::operator<<((ostream *)&lOut,"dewpoint:    ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->temperature_altitude_msl_m)._M_elems + lVar4))
    ;
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"C\n");
  std::operator<<((ostream *)&lOut,"temp_alt:    ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->temperatures_aloft_deg_c)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"m\n");
  std::operator<<((ostream *)&lOut,"temp:        ");
  for (lVar4 = -0x34; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<(&lOut,*(float *)((long)(this->cloud_type)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"C\n");
  std::operator<<((ostream *)&lOut,"cloud_type:  ");
  for (lVar4 = -0xc; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->cloud_coverage_percent)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"0=Ci, 1=St, 2=Cu, 3=Cb\n");
  std::operator<<((ostream *)&lOut,"cloud_cover: ");
  for (lVar4 = -0xc; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->cloud_base_msl_m)._M_elems + lVar4) * 100.0);
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"%\n");
  std::operator<<((ostream *)&lOut,"cloud_base:  ");
  for (lVar4 = -0xc; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (&lOut,*(float *)((long)(this->cloud_tops_msl_m)._M_elems + lVar4));
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"m\n");
  std::operator<<((ostream *)&lOut,"cloud_tops:  ");
  for (lVar4 = -0xc; lVar4 != 0; lVar4 = lVar4 + 4) {
    *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 8;
    poVar2 = (ostream *)
             std::ostream::operator<<(&lOut,*(float *)((long)(&this->cloud_tops_msl_m + 1) + lVar4))
    ;
    std::operator<<(poVar2," ");
  }
  std::operator<<((ostream *)&lOut,"m\n");
  *(undefined8 *)((long)local_198 + *(long *)(_lOut + -0x18) + 8) = 0;
  poVar2 = std::operator<<((ostream *)&lOut,"tropo_temp:  ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->tropo_temp_c);
  std::operator<<(poVar2,"c, ");
  poVar2 = std::operator<<((ostream *)&lOut,"tropo_alt: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->tropo_alt_m);
  std::operator<<(poVar2,"m, ");
  poVar2 = std::operator<<((ostream *)&lOut,"thermal_rate: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->thermal_rate_ms);
  std::operator<<(poVar2,"m/s, ");
  poVar2 = std::operator<<((ostream *)&lOut,"wave_amp: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->wave_amplitude);
  std::operator<<(poVar2,"m, ");
  poVar2 = std::operator<<((ostream *)&lOut,"wave_dir: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->wave_dir);
  std::operator<<(poVar2,"deg, ");
  poVar2 = std::operator<<((ostream *)&lOut,"rwy_fric: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->runway_friction);
  std::operator<<(poVar2,", ");
  poVar2 = std::operator<<((ostream *)&lOut,"variability: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->variability_pct * 100.0);
  std::operator<<(poVar2,"%\n");
  if (((-1 < this->change_mode) || (-1 < this->weather_source)) || (-1 < this->weather_preset)) {
    poVar2 = std::operator<<((ostream *)&lOut,"immediately: ");
    poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
    std::operator<<(poVar2,", ");
    poVar2 = std::operator<<((ostream *)&lOut,"change mode: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->change_mode);
    std::operator<<(poVar2,", ");
    poVar2 = std::operator<<((ostream *)&lOut,"source: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->weather_source);
    std::operator<<(poVar2,", ");
    poVar2 = std::operator<<((ostream *)&lOut,"preset: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->weather_preset);
    std::operator<<(poVar2,"\n");
  }
  poVar2 = std::operator<<((ostream *)&lOut,"METAR: ");
  if ((this->metar)._M_string_length == 0) {
    pcVar3 = "(nil)";
  }
  else {
    pcVar3 = (this->metar)._M_dataplus._M_p;
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,"\n");
  if ((int)dataRefs.iLogLevel < 1) {
    pcVar1 = (msg->_M_dataplus)._M_p;
    std::__cxx11::stringbuf::str();
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTWeather.cpp"
           ,0x17e,"Log",logDEBUG,"%s\n%s",pcVar1,local_1c0._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&lOut);
  return;
}

Assistant:

void LTWeather::Log (const std::string& msg) const
{
    std::ostringstream lOut;
    lOut << std::fixed << std::setprecision(1);
    lOut <<  "pos:         " << std::string(pos)         << "\n";
    lOut <<  "vis:         " << visibility_reported_sm   << "sm, ";
    lOut <<  "sea_pressure: "<< sealevel_pressure_pas    << "pas, ";
    lOut <<  "sea_temp: "    << sealevel_temperature_c   << "C, ";
    lOut <<  "qnh_base_elev: "<<qnh_base_elevation       << "?, ";
    lOut <<  "qnh_pas:"      << qnh_pas                  << ", ";
    lOut <<  "rain: "        << (rain_percent*100.0f)    << "%,\n";

#define LOG_WARR(label, var, unit)                          \
lOut << label;                                              \
for (const float& f: var) lOut << std::setw(8) << f << " "; \
lOut << unit "\n";
    
    LOG_WARR("wind_alt:    ",   wind_altitude_msl_m,        "m");
    LOG_WARR("wind_speed:  ",   wind_speed_msc,             "kts");
    LOG_WARR("wind_dir:    ",   wind_direction_degt,        "deg");
    LOG_WARR("shear_speed: ",   shear_speed_msc,            "kts");
    LOG_WARR("shear_dir:   ",   shear_direction_degt,       "deg");
    LOG_WARR("turbulence:  ",   turbulence,                 "");
    LOG_WARR("dewpoint:    ",   dewpoint_deg_c,             "C");
    LOG_WARR("temp_alt:    ",   temperature_altitude_msl_m, "m");
    LOG_WARR("temp:        ",   temperatures_aloft_deg_c,   "C");
    LOG_WARR("cloud_type:  ",   cloud_type,                 "0=Ci, 1=St, 2=Cu, 3=Cb");
    lOut <<  "cloud_cover: ";
    for (const float& f: cloud_coverage_percent) lOut << std::setw(8) << (f*100.0f) << " ";
    lOut <<  "%\n";
    LOG_WARR("cloud_base:  ",   cloud_base_msl_m,           "m");
    LOG_WARR("cloud_tops:  ",   cloud_tops_msl_m,           "m");
    lOut << std::setw(0);

    lOut <<  "tropo_temp:  " << tropo_temp_c             << "c, ";
    lOut <<  "tropo_alt: "   << tropo_alt_m              << "m, ";
    lOut <<  "thermal_rate: "<< thermal_rate_ms          << "m/s, ";
    lOut <<  "wave_amp: "    << wave_amplitude           << "m, ";
    lOut <<  "wave_dir: "    << wave_dir                 << "deg, ";
    lOut <<  "rwy_fric: "    << runway_friction          << ", ";
    lOut <<  "variability: " << (variability_pct*100.0f) << "%\n";
    
    // if any of the follow is filled (e.g. after getting weather from X-Plane for logging purposes)
    if (change_mode >= 0 || weather_source >= 0 || weather_preset >= 0) {
        lOut << "immediately: " << update_immediately << ", ";
        lOut << "change mode: " << change_mode << ", ";
        lOut << "source: " << weather_source << ", ";
        lOut << "preset: " << weather_preset << "\n";
    }
    
    lOut <<  "METAR: "       << (metar.empty() ? "(nil)" : metar.c_str()) << "\n";

    LOG_MSG(logDEBUG, "%s\n%s", msg.c_str(), lOut.str().c_str());
}